

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QByteArray * composePreprocessorOutput(QByteArray *__return_storage_ptr__,Symbols *symbols)

{
  long lVar1;
  char *pcVar2;
  Token TVar3;
  ulong __n;
  qsizetype n;
  Token TVar4;
  Token TVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  int local_ac;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_80;
  Symbol sym;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar7 = 0;
  local_ac = 1;
  uVar6 = 0;
  TVar5 = NOTOKEN;
  TVar4 = NOTOKEN;
  do {
    if ((ulong)(symbols->d).size <= uVar6) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    sym.from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    sym.len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    sym.lex.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    sym.lex.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    sym._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    sym.lex.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    Symbol::Symbol(&sym,(Symbol *)((long)&((symbols->d).ptr)->lineNum + lVar7));
    TVar3 = sym.token;
    if (sym.token - NEWLINE < 2) {
      TVar3 = PP_WHITESPACE;
      if (TVar4 != PP_WHITESPACE) {
        QByteArray::append(__return_storage_ptr__,' ');
        TVar5 = TVar4;
      }
    }
    else if (sym.token == PP_STRING_LITERAL) {
      n = 1;
      if ((TVar4 == PP_STRING_LITERAL) ||
         (n = 2, TVar4 == PP_WHITESPACE && TVar5 == PP_STRING_LITERAL)) {
        QByteArray::chop(__return_storage_ptr__,n);
        Symbol::lexem((QByteArray *)&local_98,&sym);
        QByteArray::mid((QByteArray *)&local_80,(QByteArray *)&local_98,1,-1);
        QByteArray::append(__return_storage_ptr__,(QByteArray *)&local_80);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        TVar3 = PP_STRING_LITERAL;
        TVar5 = TVar4;
      }
      else {
LAB_00112bd3:
        if (sym.lineNum - local_ac != 0 && local_ac <= sym.lineNum) {
          __n = (ulong)(uint)(sym.lineNum - local_ac);
          QByteArray::resize(__return_storage_ptr__,(__return_storage_ptr__->d).size + __n);
          pcVar2 = QByteArray::data(__return_storage_ptr__);
          memset(pcVar2 + ((__return_storage_ptr__->d).size - __n),10,__n);
          local_ac = sym.lineNum;
        }
        Symbol::lexem((QByteArray *)&local_80,&sym);
        QByteArray::append(__return_storage_ptr__,(QByteArray *)&local_80);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
        TVar5 = TVar4;
      }
    }
    else if (sym.token == MOC_INCLUDE_BEGIN) {
      local_ac = 0;
      TVar3 = TVar4;
    }
    else {
      if (sym.token != MOC_INCLUDE_END) goto LAB_00112bd3;
      local_ac = sym.lineNum;
      TVar3 = TVar4;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&sym.lex.d);
    lVar7 = lVar7 + 0x30;
    uVar6 = uVar6 + 1;
    TVar4 = TVar3;
  } while( true );
}

Assistant:

QByteArray composePreprocessorOutput(const Symbols &symbols) {
    QByteArray output;
    int lineNum = 1;
    Token last = PP_NOTOKEN;
    Token secondlast = last;
    int i = 0;
    while (hasNext(symbols, i)) {
        Symbol sym = next(symbols, i);
        switch (sym.token) {
        case PP_NEWLINE:
        case PP_WHITESPACE:
            if (last != PP_WHITESPACE) {
                secondlast = last;
                last = PP_WHITESPACE;
                output += ' ';
            }
            continue;
        case PP_STRING_LITERAL:
            if (last == PP_STRING_LITERAL)
                output.chop(1);
            else if (secondlast == PP_STRING_LITERAL && last == PP_WHITESPACE)
                output.chop(2);
            else
                break;
            output += sym.lexem().mid(1);
            secondlast = last;
            last = PP_STRING_LITERAL;
            continue;
        case MOC_INCLUDE_BEGIN:
            lineNum = 0;
            continue;
        case MOC_INCLUDE_END:
            lineNum = sym.lineNum;
            continue;
        default:
            break;
        }
        secondlast = last;
        last = sym.token;

        const int padding = sym.lineNum - lineNum;
        if (padding > 0) {
            output.resize(output.size() + padding);
            memset(output.data() + output.size() - padding, '\n', padding);
            lineNum = sym.lineNum;
        }

        output += sym.lexem();
    }

    return output;
}